

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

char * helicsQueryExecute(HelicsQuery query,HelicsFederate fed,HelicsError *err)

{
  bool bVar1;
  Federate *this;
  QueryObject *pQVar2;
  Federate *in_stack_00000028;
  undefined1 in_stack_00000030 [16];
  undefined1 in_stack_00000040 [16];
  HelicsSequencingModes in_stack_00000060;
  QueryObject *queryObj;
  Federate *fedObj;
  undefined1 in_stack_000000c0 [16];
  Federate *in_stack_ffffffffffffff40;
  HelicsError *in_stack_ffffffffffffff48;
  HelicsFederate in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *local_8;
  
  this = getFed(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (this == (Federate *)0x0) {
    local_8 = 
    "{{\n  \"error\":{{\n    \"code\":404,\n    \"message\":\"federate object is not valid\"\n  }}\n}}"
    ;
  }
  else {
    pQVar2 = anon_unknown.dwarf_1a6d0::getQueryObj
                       (in_stack_ffffffffffffff48,(HelicsError *)in_stack_ffffffffffffff40);
    if (pQVar2 == (QueryObject *)0x0) {
      local_8 = 
      "{{\n  \"error\":{{\n    \"code\":400,\n    \"message\":\"query object is not valid\"\n  }}\n}}"
      ;
    }
    else {
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1a2a64);
      if (bVar1) {
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff40);
        helics::Federate::query_abi_cxx11_
                  ((Federate *)query,(string_view)in_stack_000000c0,fed._4_4_);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff40);
      }
      else {
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        helics::Federate::query_abi_cxx11_
                  (in_stack_00000028,(string_view)in_stack_00000040,(string_view)in_stack_00000030,
                   in_stack_00000060);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        in_stack_ffffffffffffff40 = this;
      }
      local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffff40);
    }
  }
  return local_8;
}

Assistant:

const char* helicsQueryExecute(HelicsQuery query, HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return invalidFedObConst;
    }

    auto* queryObj = getQueryObj(query, err);
    if (queryObj == nullptr) {
        return invalidQueryObConst;
    }
    try {
        if (queryObj->target.empty()) {
            queryObj->response = fedObj->query(queryObj->query, queryObj->mode);
        } else {
            queryObj->response = fedObj->query(queryObj->target, queryObj->query, queryObj->mode);
        }

        return queryObj->response.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    return queryErrorString;
    // LCOV_EXCL_START
}